

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O3

uint aom_masked_sub_pixel_variance16x64_ssse3
               (uint8_t *src,int src_stride,int xoffset,int yoffset,uint8_t *ref,int ref_stride,
               uint8_t *second_pred,uint8_t *msk,int msk_stride,int invert_mask,uint *sse)

{
  uint8_t *puVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  unkuint9 Var15;
  undefined1 auVar16 [11];
  undefined1 auVar17 [13];
  undefined1 auVar18 [15];
  undefined1 auVar19 [11];
  undefined1 auVar20 [13];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  long lVar25;
  undefined1 auVar26 [16];
  int iVar28;
  int iVar29;
  undefined1 auVar27 [16];
  int iVar30;
  short sVar31;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  short sVar42;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  short sVar43;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  undefined1 auVar44 [16];
  undefined1 auVar52 [16];
  short sVar69;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar62 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar82 [16];
  uint8_t local_448 [1048];
  undefined1 auVar45 [16];
  undefined1 auVar55 [16];
  undefined1 auVar46 [16];
  undefined1 auVar56 [16];
  undefined1 auVar47 [16];
  undefined1 auVar57 [16];
  undefined1 auVar48 [16];
  undefined1 auVar58 [16];
  undefined1 auVar49 [16];
  undefined1 auVar59 [16];
  undefined1 auVar50 [16];
  undefined1 auVar60 [16];
  undefined1 auVar51 [16];
  undefined1 auVar61 [16];
  undefined1 auVar75 [16];
  undefined1 auVar83 [16];
  undefined1 auVar76 [16];
  undefined1 auVar84 [16];
  undefined1 auVar77 [16];
  undefined1 auVar85 [16];
  undefined1 auVar78 [16];
  undefined1 auVar86 [16];
  undefined1 auVar79 [16];
  undefined1 auVar87 [16];
  undefined1 auVar80 [16];
  undefined1 auVar88 [16];
  undefined1 auVar81 [16];
  undefined1 auVar89 [16];
  
  bilinear_filter(src,src_stride,xoffset,yoffset,local_448,0x10,0x40);
  if (invert_mask == 0) {
    lVar25 = 0;
    auVar27 = (undefined1  [16])0x0;
    auVar35 = (undefined1  [16])0x0;
    do {
      auVar26 = *(undefined1 (*) [16])ref;
      auVar33 = *(undefined1 (*) [16])(local_448 + lVar25);
      puVar1 = second_pred + lVar25;
      auVar62 = *(undefined1 (*) [16])msk;
      auVar61._0_14_ = auVar33._0_14_;
      auVar61[0xe] = auVar33[7];
      auVar61[0xf] = puVar1[7];
      auVar60._14_2_ = auVar61._14_2_;
      auVar60._0_13_ = auVar33._0_13_;
      auVar60[0xd] = puVar1[6];
      auVar59._13_3_ = auVar60._13_3_;
      auVar59._0_12_ = auVar33._0_12_;
      auVar59[0xc] = auVar33[6];
      auVar58._12_4_ = auVar59._12_4_;
      auVar58._0_11_ = auVar33._0_11_;
      auVar58[0xb] = puVar1[5];
      auVar57._11_5_ = auVar58._11_5_;
      auVar57._0_10_ = auVar33._0_10_;
      auVar57[10] = auVar33[5];
      auVar56._10_6_ = auVar57._10_6_;
      auVar56._0_9_ = auVar33._0_9_;
      auVar56[9] = puVar1[4];
      auVar55._9_7_ = auVar56._9_7_;
      auVar55._0_8_ = auVar33._0_8_;
      auVar55[8] = auVar33[4];
      auVar54._8_8_ = auVar55._8_8_;
      auVar54[7] = puVar1[3];
      auVar54[6] = auVar33[3];
      auVar54[5] = puVar1[2];
      auVar54[4] = auVar33[2];
      auVar54[3] = puVar1[1];
      auVar54[2] = auVar33[1];
      auVar54[0] = auVar33[0];
      auVar54[1] = *puVar1;
      auVar89._0_14_ = auVar62._0_14_;
      auVar89[0xe] = auVar62[7];
      auVar89[0xf] = '@' - auVar62[7];
      auVar88._14_2_ = auVar89._14_2_;
      auVar88._0_13_ = auVar62._0_13_;
      auVar88[0xd] = '@' - auVar62[6];
      auVar87._13_3_ = auVar88._13_3_;
      auVar87._0_12_ = auVar62._0_12_;
      auVar87[0xc] = auVar62[6];
      auVar86._12_4_ = auVar87._12_4_;
      auVar86._0_11_ = auVar62._0_11_;
      auVar86[0xb] = '@' - auVar62[5];
      auVar85._11_5_ = auVar86._11_5_;
      auVar85._0_10_ = auVar62._0_10_;
      auVar85[10] = auVar62[5];
      auVar84._10_6_ = auVar85._10_6_;
      auVar84._0_9_ = auVar62._0_9_;
      auVar84[9] = '@' - auVar62[4];
      auVar83._9_7_ = auVar84._9_7_;
      auVar83._0_8_ = auVar62._0_8_;
      auVar83[8] = auVar62[4];
      auVar82._8_8_ = auVar83._8_8_;
      auVar82[7] = '@' - auVar62[3];
      auVar82[6] = auVar62[3];
      auVar82[5] = '@' - auVar62[2];
      auVar82[4] = auVar62[2];
      auVar82[3] = '@' - auVar62[1];
      auVar82[2] = auVar62[1];
      auVar82[1] = '@' - auVar62[0];
      auVar82[0] = auVar62[0];
      auVar52 = pmaddubsw(auVar54,auVar82);
      sVar43 = pavgw(auVar52._0_2_ >> 5,0);
      sVar63 = pavgw(auVar52._2_2_ >> 5,0);
      sVar64 = pavgw(auVar52._4_2_ >> 5,0);
      sVar65 = pavgw(auVar52._6_2_ >> 5,0);
      sVar66 = pavgw(auVar52._8_2_ >> 5,0);
      sVar67 = pavgw(auVar52._10_2_ >> 5,0);
      sVar68 = pavgw(auVar52._12_2_ >> 5,0);
      sVar69 = pavgw(auVar52._14_2_ >> 5,0);
      auVar52[1] = puVar1[8];
      auVar52[0] = auVar33[8];
      auVar52[2] = auVar33[9];
      auVar52[3] = puVar1[9];
      auVar52[4] = auVar33[10];
      auVar52[5] = puVar1[10];
      auVar52[6] = auVar33[0xb];
      auVar52[7] = puVar1[0xb];
      auVar52[8] = auVar33[0xc];
      auVar52[9] = puVar1[0xc];
      auVar52[10] = auVar33[0xd];
      auVar52[0xb] = puVar1[0xd];
      auVar52[0xc] = auVar33[0xe];
      auVar52[0xd] = puVar1[0xe];
      auVar52[0xe] = auVar33[0xf];
      auVar52[0xf] = puVar1[0xf];
      auVar73[1] = '@' - auVar62[8];
      auVar73[0] = auVar62[8];
      auVar73[2] = auVar62[9];
      auVar73[3] = '@' - auVar62[9];
      auVar73[4] = auVar62[10];
      auVar73[5] = '@' - auVar62[10];
      auVar73[6] = auVar62[0xb];
      auVar73[7] = '@' - auVar62[0xb];
      auVar73[8] = auVar62[0xc];
      auVar73[9] = '@' - auVar62[0xc];
      auVar73[10] = auVar62[0xd];
      auVar73[0xb] = '@' - auVar62[0xd];
      auVar73[0xc] = auVar62[0xe];
      auVar73[0xd] = '@' - auVar62[0xe];
      auVar73[0xe] = auVar62[0xf];
      auVar73[0xf] = '@' - auVar62[0xf];
      auVar33 = pmaddubsw(auVar52,auVar73);
      sVar31 = pavgw(auVar33._0_2_ >> 5,0);
      sVar36 = pavgw(auVar33._2_2_ >> 5,0);
      sVar37 = pavgw(auVar33._4_2_ >> 5,0);
      sVar38 = pavgw(auVar33._6_2_ >> 5,0);
      sVar39 = pavgw(auVar33._8_2_ >> 5,0);
      sVar40 = pavgw(auVar33._10_2_ >> 5,0);
      sVar41 = pavgw(auVar33._12_2_ >> 5,0);
      sVar42 = pavgw(auVar33._14_2_ >> 5,0);
      auVar3[0xd] = 0;
      auVar3._0_13_ = auVar26._0_13_;
      auVar3[0xe] = auVar26[7];
      auVar5[0xc] = auVar26[6];
      auVar5._0_12_ = auVar26._0_12_;
      auVar5._13_2_ = auVar3._13_2_;
      auVar7[0xb] = 0;
      auVar7._0_11_ = auVar26._0_11_;
      auVar7._12_3_ = auVar5._12_3_;
      auVar9[10] = auVar26[5];
      auVar9._0_10_ = auVar26._0_10_;
      auVar9._11_4_ = auVar7._11_4_;
      auVar11[9] = 0;
      auVar11._0_9_ = auVar26._0_9_;
      auVar11._10_5_ = auVar9._10_5_;
      auVar13[8] = auVar26[4];
      auVar13._0_8_ = auVar26._0_8_;
      auVar13._9_6_ = auVar11._9_6_;
      auVar18._7_8_ = 0;
      auVar18._0_7_ = auVar13._8_7_;
      Var15 = CONCAT81(SUB158(auVar18 << 0x40,7),auVar26[3]);
      auVar23._9_6_ = 0;
      auVar23._0_9_ = Var15;
      auVar19._1_10_ = SUB1510(auVar23 << 0x30,5);
      auVar19[0] = auVar26[2];
      auVar24._11_4_ = 0;
      auVar24._0_11_ = auVar19;
      auVar20._1_12_ = SUB1512(auVar24 << 0x20,3);
      auVar20[0] = auVar26[1];
      auVar62._0_2_ = sVar43 - (ushort)auVar26[0];
      auVar62._2_2_ = sVar63 - auVar20._0_2_;
      auVar62._4_2_ = sVar64 - auVar19._0_2_;
      auVar62._6_2_ = sVar65 - (short)Var15;
      auVar62._8_2_ = sVar66 - auVar13._8_2_;
      auVar62._10_2_ = sVar67 - auVar9._10_2_;
      auVar62._12_2_ = sVar68 - auVar5._12_2_;
      auVar62._14_2_ = sVar69 - (auVar3._13_2_ >> 8);
      auVar33._0_2_ = sVar31 - (ushort)auVar26[8];
      auVar33._2_2_ = sVar36 - (ushort)auVar26[9];
      auVar33._4_2_ = sVar37 - (ushort)auVar26[10];
      auVar33._6_2_ = sVar38 - (ushort)auVar26[0xb];
      auVar33._8_2_ = sVar39 - (ushort)auVar26[0xc];
      auVar33._10_2_ = sVar40 - (ushort)auVar26[0xd];
      auVar33._12_2_ = sVar41 - (ushort)auVar26[0xe];
      auVar33._14_2_ = sVar42 - (ushort)auVar26[0xf];
      auVar71._0_2_ = auVar33._0_2_ + auVar62._0_2_;
      auVar71._2_2_ = auVar33._2_2_ + auVar62._2_2_;
      auVar71._4_2_ = auVar33._4_2_ + auVar62._4_2_;
      auVar71._6_2_ = auVar33._6_2_ + auVar62._6_2_;
      auVar71._8_2_ = auVar33._8_2_ + auVar62._8_2_;
      auVar71._10_2_ = auVar33._10_2_ + auVar62._10_2_;
      auVar71._12_2_ = auVar33._12_2_ + auVar62._12_2_;
      auVar71._14_2_ = auVar33._14_2_ + auVar62._14_2_;
      auVar52 = pmaddwd(auVar71,_DAT_005148e0);
      auVar26._0_4_ = auVar35._0_4_ + auVar52._0_4_;
      auVar26._4_4_ = auVar35._4_4_ + auVar52._4_4_;
      auVar26._8_4_ = auVar35._8_4_ + auVar52._8_4_;
      auVar26._12_4_ = auVar35._12_4_ + auVar52._12_4_;
      auVar62 = pmaddwd(auVar62,auVar62);
      iVar28 = auVar27._4_4_;
      iVar29 = auVar27._8_4_;
      iVar30 = auVar27._12_4_;
      auVar35 = pmaddwd(auVar33,auVar33);
      auVar27._0_4_ = auVar35._0_4_ + auVar62._0_4_ + auVar27._0_4_;
      auVar27._4_4_ = auVar35._4_4_ + auVar62._4_4_ + iVar28;
      auVar27._8_4_ = auVar35._8_4_ + auVar62._8_4_ + iVar29;
      auVar27._12_4_ = auVar35._12_4_ + auVar62._12_4_ + iVar30;
      ref = *(undefined1 (*) [16])ref + ref_stride;
      msk = *(undefined1 (*) [16])msk + msk_stride;
      lVar25 = lVar25 + 0x10;
      auVar35 = auVar26;
    } while ((int)lVar25 != 0x400);
  }
  else {
    lVar25 = 0;
    auVar27 = (undefined1  [16])0x0;
    auVar35 = (undefined1  [16])0x0;
    do {
      auVar26 = *(undefined1 (*) [16])ref;
      auVar33 = *(undefined1 (*) [16])(second_pred + lVar25);
      auVar62 = *(undefined1 (*) [16])msk;
      auVar51._0_14_ = auVar33._0_14_;
      auVar51[0xe] = auVar33[7];
      auVar51[0xf] = local_448[lVar25 + 7];
      auVar50._14_2_ = auVar51._14_2_;
      auVar50._0_13_ = auVar33._0_13_;
      auVar50[0xd] = local_448[lVar25 + 6];
      auVar49._13_3_ = auVar50._13_3_;
      auVar49._0_12_ = auVar33._0_12_;
      auVar49[0xc] = auVar33[6];
      auVar48._12_4_ = auVar49._12_4_;
      auVar48._0_11_ = auVar33._0_11_;
      auVar48[0xb] = local_448[lVar25 + 5];
      auVar47._11_5_ = auVar48._11_5_;
      auVar47._0_10_ = auVar33._0_10_;
      auVar47[10] = auVar33[5];
      auVar46._10_6_ = auVar47._10_6_;
      auVar46._0_9_ = auVar33._0_9_;
      auVar46[9] = local_448[lVar25 + 4];
      auVar45._9_7_ = auVar46._9_7_;
      auVar45._0_8_ = auVar33._0_8_;
      auVar45[8] = auVar33[4];
      auVar44._8_8_ = auVar45._8_8_;
      auVar44[7] = local_448[lVar25 + 3];
      auVar44[6] = auVar33[3];
      auVar44[5] = local_448[lVar25 + 2];
      auVar44[4] = auVar33[2];
      auVar44[3] = local_448[lVar25 + 1];
      auVar44[2] = auVar33[1];
      auVar44[0] = auVar33[0];
      auVar44[1] = local_448[lVar25];
      auVar81._0_14_ = auVar62._0_14_;
      auVar81[0xe] = auVar62[7];
      auVar81[0xf] = '@' - auVar62[7];
      auVar80._14_2_ = auVar81._14_2_;
      auVar80._0_13_ = auVar62._0_13_;
      auVar80[0xd] = '@' - auVar62[6];
      auVar79._13_3_ = auVar80._13_3_;
      auVar79._0_12_ = auVar62._0_12_;
      auVar79[0xc] = auVar62[6];
      auVar78._12_4_ = auVar79._12_4_;
      auVar78._0_11_ = auVar62._0_11_;
      auVar78[0xb] = '@' - auVar62[5];
      auVar77._11_5_ = auVar78._11_5_;
      auVar77._0_10_ = auVar62._0_10_;
      auVar77[10] = auVar62[5];
      auVar76._10_6_ = auVar77._10_6_;
      auVar76._0_9_ = auVar62._0_9_;
      auVar76[9] = '@' - auVar62[4];
      auVar75._9_7_ = auVar76._9_7_;
      auVar75._0_8_ = auVar62._0_8_;
      auVar75[8] = auVar62[4];
      auVar74._8_8_ = auVar75._8_8_;
      auVar74[7] = '@' - auVar62[3];
      auVar74[6] = auVar62[3];
      auVar74[5] = '@' - auVar62[2];
      auVar74[4] = auVar62[2];
      auVar74[3] = '@' - auVar62[1];
      auVar74[2] = auVar62[1];
      auVar74[1] = '@' - auVar62[0];
      auVar74[0] = auVar62[0];
      auVar52 = pmaddubsw(auVar44,auVar74);
      sVar43 = pavgw(auVar52._0_2_ >> 5,0);
      sVar63 = pavgw(auVar52._2_2_ >> 5,0);
      sVar64 = pavgw(auVar52._4_2_ >> 5,0);
      sVar65 = pavgw(auVar52._6_2_ >> 5,0);
      sVar66 = pavgw(auVar52._8_2_ >> 5,0);
      sVar67 = pavgw(auVar52._10_2_ >> 5,0);
      sVar68 = pavgw(auVar52._12_2_ >> 5,0);
      sVar69 = pavgw(auVar52._14_2_ >> 5,0);
      auVar32[1] = local_448[lVar25 + 8];
      auVar32[0] = auVar33[8];
      auVar32[2] = auVar33[9];
      auVar32[3] = local_448[lVar25 + 9];
      auVar32[4] = auVar33[10];
      auVar32[5] = local_448[lVar25 + 10];
      auVar32[6] = auVar33[0xb];
      auVar32[7] = local_448[lVar25 + 0xb];
      auVar32[8] = auVar33[0xc];
      auVar32[9] = local_448[lVar25 + 0xc];
      auVar32[10] = auVar33[0xd];
      auVar32[0xb] = local_448[lVar25 + 0xd];
      auVar32[0xc] = auVar33[0xe];
      auVar32[0xd] = local_448[lVar25 + 0xe];
      auVar32[0xe] = auVar33[0xf];
      auVar32[0xf] = local_448[lVar25 + 0xf];
      auVar72[1] = '@' - auVar62[8];
      auVar72[0] = auVar62[8];
      auVar72[2] = auVar62[9];
      auVar72[3] = '@' - auVar62[9];
      auVar72[4] = auVar62[10];
      auVar72[5] = '@' - auVar62[10];
      auVar72[6] = auVar62[0xb];
      auVar72[7] = '@' - auVar62[0xb];
      auVar72[8] = auVar62[0xc];
      auVar72[9] = '@' - auVar62[0xc];
      auVar72[10] = auVar62[0xd];
      auVar72[0xb] = '@' - auVar62[0xd];
      auVar72[0xc] = auVar62[0xe];
      auVar72[0xd] = '@' - auVar62[0xe];
      auVar72[0xe] = auVar62[0xf];
      auVar72[0xf] = '@' - auVar62[0xf];
      auVar33 = pmaddubsw(auVar32,auVar72);
      sVar31 = pavgw(auVar33._0_2_ >> 5,0);
      sVar36 = pavgw(auVar33._2_2_ >> 5,0);
      sVar37 = pavgw(auVar33._4_2_ >> 5,0);
      sVar38 = pavgw(auVar33._6_2_ >> 5,0);
      sVar39 = pavgw(auVar33._8_2_ >> 5,0);
      sVar40 = pavgw(auVar33._10_2_ >> 5,0);
      sVar41 = pavgw(auVar33._12_2_ >> 5,0);
      sVar42 = pavgw(auVar33._14_2_ >> 5,0);
      auVar2[0xd] = 0;
      auVar2._0_13_ = auVar26._0_13_;
      auVar2[0xe] = auVar26[7];
      auVar4[0xc] = auVar26[6];
      auVar4._0_12_ = auVar26._0_12_;
      auVar4._13_2_ = auVar2._13_2_;
      auVar6[0xb] = 0;
      auVar6._0_11_ = auVar26._0_11_;
      auVar6._12_3_ = auVar4._12_3_;
      auVar8[10] = auVar26[5];
      auVar8._0_10_ = auVar26._0_10_;
      auVar8._11_4_ = auVar6._11_4_;
      auVar10[9] = 0;
      auVar10._0_9_ = auVar26._0_9_;
      auVar10._10_5_ = auVar8._10_5_;
      auVar12[8] = auVar26[4];
      auVar12._0_8_ = auVar26._0_8_;
      auVar12._9_6_ = auVar10._9_6_;
      auVar14._7_8_ = 0;
      auVar14._0_7_ = auVar12._8_7_;
      Var15 = CONCAT81(SUB158(auVar14 << 0x40,7),auVar26[3]);
      auVar21._9_6_ = 0;
      auVar21._0_9_ = Var15;
      auVar16._1_10_ = SUB1510(auVar21 << 0x30,5);
      auVar16[0] = auVar26[2];
      auVar22._11_4_ = 0;
      auVar22._0_11_ = auVar16;
      auVar17._1_12_ = SUB1512(auVar22 << 0x20,3);
      auVar17[0] = auVar26[1];
      auVar53._0_2_ = sVar43 - (ushort)auVar26[0];
      auVar53._2_2_ = sVar63 - auVar17._0_2_;
      auVar53._4_2_ = sVar64 - auVar16._0_2_;
      auVar53._6_2_ = sVar65 - (short)Var15;
      auVar53._8_2_ = sVar66 - auVar12._8_2_;
      auVar53._10_2_ = sVar67 - auVar8._10_2_;
      auVar53._12_2_ = sVar68 - auVar4._12_2_;
      auVar53._14_2_ = sVar69 - (auVar2._13_2_ >> 8);
      auVar34._0_2_ = sVar31 - (ushort)auVar26[8];
      auVar34._2_2_ = sVar36 - (ushort)auVar26[9];
      auVar34._4_2_ = sVar37 - (ushort)auVar26[10];
      auVar34._6_2_ = sVar38 - (ushort)auVar26[0xb];
      auVar34._8_2_ = sVar39 - (ushort)auVar26[0xc];
      auVar34._10_2_ = sVar40 - (ushort)auVar26[0xd];
      auVar34._12_2_ = sVar41 - (ushort)auVar26[0xe];
      auVar34._14_2_ = sVar42 - (ushort)auVar26[0xf];
      auVar70._0_2_ = auVar34._0_2_ + auVar53._0_2_;
      auVar70._2_2_ = auVar34._2_2_ + auVar53._2_2_;
      auVar70._4_2_ = auVar34._4_2_ + auVar53._4_2_;
      auVar70._6_2_ = auVar34._6_2_ + auVar53._6_2_;
      auVar70._8_2_ = auVar34._8_2_ + auVar53._8_2_;
      auVar70._10_2_ = auVar34._10_2_ + auVar53._10_2_;
      auVar70._12_2_ = auVar34._12_2_ + auVar53._12_2_;
      auVar70._14_2_ = auVar34._14_2_ + auVar53._14_2_;
      auVar33 = pmaddwd(auVar70,_DAT_005148e0);
      auVar26._0_4_ = auVar35._0_4_ + auVar33._0_4_;
      auVar26._4_4_ = auVar35._4_4_ + auVar33._4_4_;
      auVar26._8_4_ = auVar35._8_4_ + auVar33._8_4_;
      auVar26._12_4_ = auVar35._12_4_ + auVar33._12_4_;
      auVar33 = pmaddwd(auVar53,auVar53);
      iVar28 = auVar27._4_4_;
      iVar29 = auVar27._8_4_;
      iVar30 = auVar27._12_4_;
      auVar35 = pmaddwd(auVar34,auVar34);
      auVar27._0_4_ = auVar35._0_4_ + auVar33._0_4_ + auVar27._0_4_;
      auVar27._4_4_ = auVar35._4_4_ + auVar33._4_4_ + iVar28;
      auVar27._8_4_ = auVar35._8_4_ + auVar33._8_4_ + iVar29;
      auVar27._12_4_ = auVar35._12_4_ + auVar33._12_4_ + iVar30;
      ref = *(undefined1 (*) [16])ref + ref_stride;
      msk = *(undefined1 (*) [16])msk + msk_stride;
      lVar25 = lVar25 + 0x10;
      auVar35 = auVar26;
    } while ((int)lVar25 != 0x400);
  }
  auVar35 = phaddd(auVar26,auVar27);
  auVar35 = phaddd(auVar35,auVar35);
  *sse = auVar35._4_4_;
  return auVar35._4_4_ - (int)((ulong)((long)auVar35._0_4_ * (long)auVar35._0_4_) >> 10);
}

Assistant:

static inline __m128i filter_block(const __m128i a, const __m128i b,
                                   const __m128i filter) {
  __m128i v0 = _mm_unpacklo_epi8(a, b);
  v0 = _mm_maddubs_epi16(v0, filter);
  v0 = xx_roundn_epu16(v0, FILTER_BITS);

  __m128i v1 = _mm_unpackhi_epi8(a, b);
  v1 = _mm_maddubs_epi16(v1, filter);
  v1 = xx_roundn_epu16(v1, FILTER_BITS);

  return _mm_packus_epi16(v0, v1);
}